

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperUtils.c
# Opt level: O0

void Map_MappingReportChoices(Map_Man_t *pMan)

{
  uint uVar1;
  uint uVar2;
  int LevelMax2;
  int LevelMax1;
  int i;
  int nChoices;
  int nChoiceNodes;
  Map_Node_t *pTemp;
  Map_Node_t *pNode;
  Map_Man_t *pMan_local;
  
  uVar1 = Map_MappingGetMaxLevel(pMan);
  pMan->nTravIds = pMan->nTravIds + 1;
  for (LevelMax2 = 0; LevelMax2 < pMan->nOutputs; LevelMax2 = LevelMax2 + 1) {
    Map_MappingUpdateLevel_rec
              (pMan,(Map_Node_t *)((ulong)pMan->pOutputs[LevelMax2] & 0xfffffffffffffffe),0);
  }
  uVar2 = Map_MappingGetMaxLevel(pMan);
  LevelMax1 = 0;
  i = 0;
  for (LevelMax2 = 0; LevelMax2 < pMan->vMapObjs->nSize; LevelMax2 = LevelMax2 + 1) {
    _nChoices = pMan->vMapObjs->pArray[LevelMax2];
    if ((_nChoices->pRepr == (Map_Node_t *)0x0) && (_nChoices->pNextE != (Map_Node_t *)0x0)) {
      i = i + 1;
      for (; _nChoices != (Map_Node_t *)0x0; _nChoices = _nChoices->pNextE) {
        LevelMax1 = LevelMax1 + 1;
      }
    }
  }
  printf("Maximum level: Original = %d. Reduced due to choices = %d.\n",(ulong)uVar1,(ulong)uVar2);
  printf("Choice stats:  Choice nodes = %d. Total choices = %d.\n",(ulong)(uint)i,
         (ulong)(uint)LevelMax1);
  return;
}

Assistant:

void Map_MappingReportChoices( Map_Man_t * pMan )
{
    Map_Node_t * pNode, * pTemp;
    int nChoiceNodes, nChoices;
    int i, LevelMax1, LevelMax2;

    // report the number of levels
    LevelMax1 = Map_MappingGetMaxLevel( pMan );
    pMan->nTravIds++;
    for ( i = 0; i < pMan->nOutputs; i++ )
        Map_MappingUpdateLevel_rec( pMan, Map_Regular(pMan->pOutputs[i]), 0 );
    LevelMax2 = Map_MappingGetMaxLevel( pMan );

    // report statistics about choices
    nChoiceNodes = nChoices = 0;
    for ( i = 0; i < pMan->vMapObjs->nSize; i++ )
    {
        pNode = pMan->vMapObjs->pArray[i];
        if ( pNode->pRepr == NULL && pNode->pNextE != NULL )
        { // this is a choice node = the primary node that has equivalent nodes
            nChoiceNodes++;
            for ( pTemp = pNode; pTemp; pTemp = pTemp->pNextE )
                nChoices++;
        }
    }
    printf( "Maximum level: Original = %d. Reduced due to choices = %d.\n", LevelMax1, LevelMax2 );
    printf( "Choice stats:  Choice nodes = %d. Total choices = %d.\n", nChoiceNodes, nChoices );
}